

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

string * duckdb::StringUtil::ToJSONMap
                   (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *map)

{
  bool bVar1;
  yyjson_mut_doc *pyVar2;
  yyjson_val_pool *pyVar3;
  usize in_RSI;
  yyjson_alc *in_RDI;
  yyjson_mut_val *root;
  yyjson_mut_doc *doc;
  yyjson_mut_val *val;
  yyjson_val_pool *pool;
  yyjson_alc *alc;
  yyjson_mut_val *val_1;
  yyjson_alc *alc_00;
  yyjson_val_pool *in_stack_ffffffffffffffa8;
  yyjson_mut_val *local_48;
  yyjson_mut_val *in_stack_ffffffffffffffe8;
  yyjson_mut_doc *in_stack_fffffffffffffff0;
  yyjson_mut_val *in_stack_fffffffffffffff8;
  
  alc_00 = in_RDI;
  pyVar2 = duckdb_yyjson::yyjson_mut_doc_new(in_RDI);
  if (pyVar2 != (yyjson_mut_doc *)0x0) {
    in_stack_ffffffffffffffe8 = (yyjson_mut_val *)0x1;
    pyVar3 = &pyVar2->val_pool;
    in_stack_fffffffffffffff0 = pyVar2;
    if ((((long)(pyVar2->val_pool).end - (long)pyVar3->cur) / 0x18 == 0) &&
       (bVar1 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(in_stack_ffffffffffffffa8,alc_00,in_RSI),
       ((bVar1 ^ 0xffU) & 1) != 0)) {
      local_48 = (yyjson_mut_val *)0x0;
    }
    else {
      local_48 = pyVar3->cur;
      pyVar3->cur = pyVar3->cur + (long)in_stack_ffffffffffffffe8;
    }
    in_stack_fffffffffffffff8 = local_48;
    if (local_48 != (yyjson_mut_val *)0x0) {
      local_48->tag = 7;
      goto LAB_005846cb;
    }
  }
  local_48 = (yyjson_mut_val *)0x0;
LAB_005846cb:
  if (pyVar2 != (yyjson_mut_doc *)0x0) {
    pyVar2->root = local_48;
  }
  ToJsonMapInternal((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8
                   );
  return (string *)in_RDI;
}

Assistant:

string StringUtil::ToJSONMap(const unordered_map<string, string> &map) {
	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	return ToJsonMapInternal(map, doc, root);
}